

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_LDI(void)

{
  bool bVar1;
  byte bVar2;
  Z80Reg ZVar3;
  EBracketType EVar4;
  int iVar5;
  Z80Reg ZVar6;
  ulong uVar7;
  Z80Reg reg;
  Z80Reg reg2;
  int e [14];
  
  bVar1 = Options::noFakes(false);
  if (bVar1) {
    EmitByte(0xed,true);
    EmitByte(0xa0,false);
  }
  else {
    do {
      e[6] = -1;
      e[7] = -1;
      e[8] = -1;
      e[9] = -1;
      e[2] = -1;
      e[3] = -1;
      e[4] = -1;
      e[5] = -1;
      reg = Z80_UNK;
      reg2 = Z80_UNK;
      e[0] = -1;
      e[1] = -1;
      e[10] = -1;
      e[0xb] = -1;
      ZVar3 = GetRegister(&::lp);
      if ((uint)ZVar3 < 6) {
        bVar1 = comma(&::lp);
        if ((bVar1) && (EVar4 = OpenBracket(&::lp), EVar4 != BT_NONE)) {
          Options::noFakes(true);
          ZVar6 = GetRegister(&::lp);
          if (ZVar6 == Z80_HL) {
            reg2 = ~Z80_C;
            e[0] = 0x23;
            iVar5 = CloseBracket(&::lp);
            if (iVar5 != 0) {
              reg = ZVar3 * 8 + (Z80_SP|Z80_MEM_HL);
            }
          }
          else if ((ZVar6 == Z80_IX) || (ZVar6 == Z80_IY)) {
            e[1] = -2;
            reg2 = ZVar3 * 8 + (Z80_SP|Z80_MEM_HL);
            e[3] = 0x23;
            bVar2 = z80GetIDxoffset(&::lp);
            e[0] = (int)bVar2;
            iVar5 = CloseBracket(&::lp);
            if (iVar5 != 0) {
              reg = ZVar6;
              e[2] = ZVar6;
            }
          }
        }
      }
      else if (ZVar3 == Z80_MEM_HL) {
        bVar1 = comma(&::lp);
        if (bVar1) {
          ZVar3 = GetRegister(&::lp);
          if (ZVar3 == Z80_UNK) {
            Options::noFakes(true);
            e[0] = -2;
            reg = Z80_HL|Z80_MEM_HL;
            bVar2 = GetByteNoMem(&::lp,false);
            reg2 = (Z80Reg)bVar2;
            e[1] = 0x23;
          }
          else if (((uint)ZVar3 < 6) || (ZVar3 == Z80_A)) {
            Options::noFakes(true);
            reg2 = ~Z80_C;
            e[0] = 0x23;
            reg = ZVar3 + (Z80_SP|Z80_HL);
          }
          else if ((ZVar3 == Z80_BC) || (ZVar3 == Z80_DE)) {
            Options::noFakes(true);
            e[3] = -2;
            e[1] = -2;
            reg2 = ~Z80_C;
            ZVar6 = GetRegister_r16Low(ZVar3);
            reg = ZVar6 + (Z80_SP|Z80_HL);
            ZVar3 = GetRegister_r16High(ZVar3);
            e[4] = 0x23;
            e[0] = 0x23;
            e[2] = ZVar3 + (Z80_SP|Z80_HL);
          }
        }
      }
      else if (ZVar3 == Z80_A) {
        bVar1 = comma(&::lp);
        if ((bVar1) && (EVar4 = OpenBracket(&::lp), EVar4 != BT_NONE)) {
          Options::noFakes(true);
          ZVar3 = GetRegister(&::lp);
          if ((ZVar3 == Z80_BC) || (ZVar3 == Z80_DE)) {
            iVar5 = CloseBracket(&::lp);
            if (iVar5 != 0) {
              reg = ZVar3 + ~Z80_L;
            }
            reg2 = ~Z80_C;
            e[0] = ZVar3 + ~(Z80_I|Z80_H);
          }
          else if (ZVar3 == Z80_HL) {
            reg2 = ~Z80_C;
            e[0] = 0x23;
            iVar5 = CloseBracket(&::lp);
            if (iVar5 != 0) {
              reg = Z80_SP|Z80_HL|Z80_I|Z80_MEM_HL;
            }
          }
          else if ((ZVar3 == Z80_IX) || (ZVar3 == Z80_IY)) {
            e[1] = -2;
            reg2 = Z80_SP|Z80_HL|Z80_I|Z80_MEM_HL;
            e[3] = 0x23;
            bVar2 = z80GetIDxoffset(&::lp);
            e[0] = (int)bVar2;
            iVar5 = CloseBracket(&::lp);
            if (iVar5 != 0) {
              reg = ZVar3;
              e[2] = ZVar3;
            }
          }
        }
      }
      else if (((ZVar3 == Z80_BC) || (ZVar3 == Z80_DE)) || (ZVar3 == Z80_HL)) {
        bVar1 = comma(&::lp);
        if (bVar1) {
          ZVar6 = GetRegister(&::lp);
          if (ZVar6 == Z80_MEM_HL) {
            if (ZVar3 != Z80_HL) {
              Options::noFakes(true);
              e[3] = -2;
              e[1] = -2;
              reg2 = ~Z80_C;
              reg = ZVar3 + (Z80_HL|Z80_I|Z80_MEM_HL);
              e[0] = 0x23;
              e[2] = ZVar3 + (Z80_HL|Z80_MEM_HL);
              e[4] = 0x23;
            }
          }
          else if ((ZVar6 == Z80_MEM_IX) || (ZVar6 == Z80_MEM_IY)) {
            Options::noFakes(true);
            e[8] = -2;
            e[4] = -2;
            e[1] = -2;
            e[7] = GetRegister_lastIxyD;
            e[0] = GetRegister_lastIxyD;
            reg = ZVar6 & 0xff;
            reg2 = ZVar3 + (Z80_HL|Z80_I|Z80_MEM_HL);
            e[6] = ZVar3 + (Z80_HL|Z80_MEM_HL);
            e[10] = 0x23;
            e[3] = 0x23;
            e[2] = reg;
            e[5] = reg;
            e[9] = reg;
          }
        }
      }
      else if ((ZVar3 == Z80_MEM_IX) || (ZVar3 == Z80_MEM_IY)) {
        bVar1 = comma(&::lp);
        if (bVar1) {
          ZVar6 = GetRegister(&::lp);
          if (ZVar6 == Z80_UNK) {
            Options::noFakes(true);
            reg = ZVar3 & 0xff;
            reg2 = Z80_HL|Z80_MEM_HL;
            e[0] = GetRegister_lastIxyD;
            e[3] = reg;
            bVar2 = GetByteNoMem(&::lp,false);
            e[1] = (int)bVar2;
            e[2] = -2;
            e[4] = 0x23;
          }
          else if (((uint)ZVar6 < 6) || (ZVar6 == Z80_A)) {
            Options::noFakes(true);
            e[1] = -2;
            reg = ZVar3 & 0xff;
            e[0] = GetRegister_lastIxyD;
            reg2 = ZVar6 + (Z80_SP|Z80_HL);
            e[3] = 0x23;
            e[2] = reg;
          }
          else if (((ZVar6 == Z80_BC) || (ZVar6 == Z80_DE)) || (ZVar6 == Z80_HL)) {
            Options::noFakes(true);
            e[8] = -2;
            e[4] = -2;
            e[1] = -2;
            reg = ZVar3 & 0xff;
            e[10] = 0x23;
            e[3] = 0x23;
            e[7] = GetRegister_lastIxyD;
            e[0] = GetRegister_lastIxyD;
            e[2] = reg;
            e[5] = reg;
            e[9] = reg;
            ZVar3 = GetRegister_r16Low(ZVar6);
            reg2 = ZVar3 + (Z80_SP|Z80_HL);
            ZVar3 = GetRegister_r16High(ZVar6);
            e[6] = ZVar3 + (Z80_SP|Z80_HL);
          }
        }
      }
      else {
        EVar4 = OpenBracket(&::lp);
        if (EVar4 == BT_NONE) {
          reg = 0xed;
          reg2 = 0xa0;
        }
        else {
          ZVar3 = GetRegister(&::lp);
          iVar5 = CloseBracket(&::lp);
          if ((((iVar5 != 0) && (bVar1 = comma(&::lp), bVar1)) &&
              ((ZVar3 == Z80_BC || (ZVar3 == Z80_DE)))) &&
             (ZVar6 = GetRegister(&::lp), ZVar6 == Z80_A)) {
            Options::noFakes(true);
            reg2 = ~Z80_C;
            reg = ZVar3 + ~(Z80_I|Z80_L);
            e[0] = ZVar3 + ~(Z80_I|Z80_H);
          }
        }
      }
      EmitBytes(&reg,true);
      uVar7 = (*DAT_001e16b0)(&::lp);
    } while ((uVar7 & 1) != 0);
  }
  return;
}

Assistant:

static void OpCode_LDI() {
		if (Options::noFakes(false)) {
			EmitByte(0xED, true);
			EmitByte(0xA0);
			return;
		}

		// only when fakes are enabled (but they may be silent/warning enabled, so extra checks needed)
		do {
			int e[] { -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1 };
			Z80Reg reg2 = Z80_UNK, reg = GetRegister(lp);
			switch (reg) {
			case Z80_A:
				if (!comma(lp)) break;
				if (BT_NONE == OpenBracket(lp)) break;
				Options::noFakes();		// to display warning if "-f"
				switch (reg = GetRegister(lp)) {
				case Z80_BC:	// 0A 03
				case Z80_DE:	// 1A 13
					if (CloseBracket(lp)) e[0] = reg - Z80_BC + 0x0a;
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = reg - Z80_BC + 0x03;
					break;
				case Z80_HL:
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = 0x23;
					if (CloseBracket(lp)) e[0] = 0x7e;
					break;
				case Z80_IX:
				case Z80_IY:
					e[3] = INSTRUCTION_START_MARKER;
					e[1] = 0x7e; e[5] = 0x23; e[2] = z80GetIDxoffset(lp);
					if (CloseBracket(lp)) e[0] = e[4] = reg;
					break;
				default:
					break;
				}
				break;
			case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L:
				if (!comma(lp)) break;
				if (BT_NONE == OpenBracket(lp)) break;
				Options::noFakes();		// to display warning if "-f"
				switch (reg2 = GetRegister(lp)) {
				case Z80_HL:
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = 0x23; if (CloseBracket(lp)) e[0] = 0x46 + reg * 8;
					break;
				case Z80_IX:
				case Z80_IY:
					e[3] = INSTRUCTION_START_MARKER;
					e[1] = 0x46 + reg * 8; e[5] = 0x23; e[2] = z80GetIDxoffset(lp);
					if (CloseBracket(lp)) e[0] = e[4] = reg2;
					break;
				default:
					break;
				}
				break;
			case Z80_BC: case Z80_DE: case Z80_HL:
				if (!comma(lp)) break;
				switch (reg2 = GetRegister(lp)) {
				case Z80_MEM_HL:
					if (Z80_HL == reg) break;
					Options::noFakes();		// to display warning if "-f"
					e[1] = e[3] = e[5] = INSTRUCTION_START_MARKER;
					e[0] = 0x3e + reg;
					e[2] = 0x23;
					e[4] = 0x36 + reg;
					e[6] = 0x23;
					break;
				case Z80_MEM_IX: case Z80_MEM_IY:
					Options::noFakes();		// to display warning if "-f"
					e[3] = e[6] = e[10] = INSTRUCTION_START_MARKER;
					e[2] = e[9] = GetRegister_lastIxyD;
					e[0] = e[4] = e[7] = e[11] = reg2&0xFF;
					e[1] = 0x3e + reg; e[8] = 0x36 + reg; e[5] = e[12] = 0x23;
					break;
				default:
					break;
				}
				break;
			case Z80_MEM_HL:
				if (!comma(lp)) break;
				switch (reg = GetRegister(lp)) {
				case Z80_A: case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L:
					Options::noFakes();		// to display warning if "-f"
					e[1] = INSTRUCTION_START_MARKER;
					e[0] = 0x70 + reg; e[2] = 0x23; break;
				case Z80_BC: case Z80_DE:
					Options::noFakes();		// to display warning if "-f"
					e[1] = e[3] = e[5] = INSTRUCTION_START_MARKER;
					e[0] = 0x70 + GetRegister_r16Low(reg); e[4] = 0x70 + GetRegister_r16High(reg);
					e[2] = e[6] = 0x23; break;
				case Z80_UNK:
					Options::noFakes();		// to display warning if "-f"
					e[2] = INSTRUCTION_START_MARKER;
					e[0] = 0x36; e[1] = GetByteNoMem(lp); e[3] = 0x23; break;
				default:
					break;
				}
				break;
			case Z80_MEM_IX: case Z80_MEM_IY:
				if (!comma(lp)) break;
				switch (reg2 = GetRegister(lp)) {
				case Z80_A: case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L:
					Options::noFakes();		// to display warning if "-f"
					e[3] = INSTRUCTION_START_MARKER;
					e[0] = e[4] = reg&0xFF; e[2] = GetRegister_lastIxyD; e[1] = 0x70 + reg2; e[5] = 0x23; break;
				case Z80_BC: case Z80_DE: case Z80_HL:
					Options::noFakes();		// to display warning if "-f"
					e[3] = e[6] = e[10] = INSTRUCTION_START_MARKER;
					e[0] = e[4] = e[7] = e[11] = reg&0xFF; e[5] = e[12] = 0x23; e[2] = e[9] = GetRegister_lastIxyD;
					e[1] = 0x70 + GetRegister_r16Low(reg2); e[8] = 0x70 + GetRegister_r16High(reg2); break;
				case Z80_UNK:
					Options::noFakes();		// to display warning if "-f"
					e[0] = e[5] = reg&0xFF; e[1] = 0x36; e[2] = GetRegister_lastIxyD; e[3] = GetByteNoMem(lp);
					e[4] = INSTRUCTION_START_MARKER;
					e[6] = 0x23; break;
				default:
					break;
				}
				break;
			default:
				if (BT_NONE != OpenBracket(lp)) {
					reg = GetRegister(lp);
					if (!CloseBracket(lp) || !comma(lp)) break;
					if ((Z80_BC != reg && Z80_DE != reg) || Z80_A != GetRegister(lp)) break;
					Options::noFakes();
					e[1] = INSTRUCTION_START_MARKER;
					e[0] = reg - 14; e[2] = reg - 13;	// LDI (bc|de),a
				} else {
					e[0] = 0xed; e[1] = 0xa0;			// regular LDI
				}
			}

			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}